

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnF64ConstExpr(BinaryReaderIR *this,uint64_t value_bits)

{
  Location local_88;
  Const local_68;
  unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> local_30;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28;
  uint64_t local_20;
  uint64_t value_bits_local;
  BinaryReaderIR *this_local;
  
  local_20 = value_bits;
  value_bits_local = (uint64_t)this;
  GetLocation(&local_88,this);
  Const::F64(&local_68,value_bits,&local_88);
  MakeUnique<wabt::ConstExpr,wabt::Const>((wabt *)&local_30,&local_68);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_28,&local_30);
  this_local._4_4_ = AppendExpr(this,&local_28);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_28);
  std::unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_>::~unique_ptr(&local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnF64ConstExpr(uint64_t value_bits) {
  return AppendExpr(
      MakeUnique<ConstExpr>(Const::F64(value_bits, GetLocation())));
}